

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valsrc_state.c
# Opt level: O1

int mpt_valsrc_state(mpt_valsrc *src,char *data)

{
  ushort *puVar1;
  ushort **ppuVar2;
  long lVar3;
  uint8_t uVar4;
  byte bVar5;
  
  if (data != (char *)0x0) {
    bVar5 = *data;
    if ((long)(char)bVar5 != 0) {
      ppuVar2 = __ctype_b_loc();
      puVar1 = *ppuVar2;
      if ((*(byte *)((long)puVar1 + (long)(char)bVar5 * 2 + 1) & 4) != 0) {
        if ((*(byte *)((long)puVar1 + (long)data[1] * 2 + 1) & 4) != 0) {
          return -2;
        }
        if (bVar5 < 0x61) {
          if (bVar5 < 0x49) {
            if (bVar5 == 0x41) {
              uVar4 = '\0';
            }
            else {
              if (bVar5 != 0x46) goto LAB_00108911;
              uVar4 = '\x03';
            }
          }
          else if (bVar5 == 0x49) {
            uVar4 = '\x06';
          }
          else {
            if (bVar5 != 0x53) goto LAB_00108911;
            uVar4 = '\x05';
          }
        }
        else if (bVar5 < 0x69) {
          if (bVar5 == 0x61) {
            uVar4 = '\a';
          }
          else {
            if (bVar5 != 0x66) goto LAB_00108911;
            uVar4 = '\x04';
          }
        }
        else {
          uVar4 = '\x01';
          if (bVar5 != 0x69) {
            if (bVar5 != 0x73) goto LAB_00108911;
            uVar4 = '\x02';
          }
        }
        src->state = uVar4;
        bVar5 = data[2];
        if (bVar5 == 0) {
          return 1;
        }
        lVar3 = 3;
        do {
          if ((*(byte *)((long)puVar1 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) break;
          bVar5 = data[lVar3];
          lVar3 = lVar3 + 1;
        } while (bVar5 != 0);
        return (int)lVar3 + -2;
      }
    }
  }
LAB_00108911:
  src->state = '\x02';
  return 0;
}

Assistant:

extern int mpt_valsrc_state(MPT_STRUCT(valsrc) *src, const char *data)
{
	uint8_t state;
	int curr;
	
	/* special validity for binding */
	if (!data || !*data) {
		src->state = MPT_DATASTATE(Step);
		return 0;
	}
	if (!isalpha(*data)) {
		src->state = MPT_DATASTATE(Step);
		return 0;
	}
	if (isalpha(data[1])) {
		return MPT_ERROR(BadValue);
	}
	switch (*data++) {
		case 'i': state = MPT_DATASTATE(Init); break;
		case 'I': state = MPT_DATASTATE(All) & ~MPT_DATASTATE(Init); break;
		case 's': state = MPT_DATASTATE(Step); break;
		case 'S': state = MPT_DATASTATE(All) & ~MPT_DATASTATE(Step); break;
		case 'f': state = MPT_DATASTATE(Fini); break;
		case 'F': state = MPT_DATASTATE(All) & ~MPT_DATASTATE(Fini); break;
		case 'A': state = 0; break;
		case 'a': state = MPT_DATASTATE(All); break;
		default:
			src->state = MPT_DATASTATE(Step);
			return 0;
	}
	src->state = state;
	curr = 1;
	while ((state = *(++data))) {
		if (!isspace(state)) {
			return curr;
		}
		++curr;
	}
	return curr;
}